

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionChamberElementType::IfcDistributionChamberElementType
          (IfcDistributionChamberElementType *this)

{
  *(undefined ***)&this->field_0x1d0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1d8 = 0;
  *(char **)&this->field_0x1e0 = "IfcDistributionChamberElementType";
  IfcDistributionFlowElementType::IfcDistributionFlowElementType
            (&this->super_IfcDistributionFlowElementType,&PTR_construction_vtable_24__007c8150);
  *(undefined8 *)&(this->super_IfcDistributionFlowElementType).field_0x1a8 = 0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x7c7ff8;
  *(undefined8 *)&this->field_0x1d0 = 0x7c8138;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x7c8020;
  (this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
  .super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7c8048;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x7c8070;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x148 = 0x7c8098;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x180 = 0x7c80c0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x7c80e8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.field_0x1a0 =
       0x7c8110;
  *(undefined1 **)&(this->super_IfcDistributionFlowElementType).field_0x1b0 = &this->field_0x1c0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  this->field_0x1c0 = 0;
  return;
}

Assistant:

IfcDistributionChamberElementType() : Object("IfcDistributionChamberElementType") {}